

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

String * __thiscall
kj::_::Debug::makeDescription<char_const(&)[45]>
          (String *__return_storage_ptr__,Debug *this,char *macroArgs,char (*params) [45])

{
  char *pcVar1;
  size_t sVar2;
  ArrayPtr<kj::String> argValues_00;
  String argValues [1];
  String local_38;
  
  str<char_const(&)[45]>(&local_38,(kj *)macroArgs,(char (*) [45])macroArgs);
  argValues_00.size_ = 1;
  argValues_00.ptr = &local_38;
  makeDescriptionInternal(__return_storage_ptr__,(char *)this,argValues_00);
  sVar2 = local_38.content.size_;
  pcVar1 = local_38.content.ptr;
  if (local_38.content.ptr != (char *)0x0) {
    local_38.content.ptr = (char *)0x0;
    local_38.content.size_ = 0;
    (**(local_38.content.disposer)->_vptr_ArrayDisposer)
              (local_38.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

String Debug::makeDescription(const char* macroArgs, Params&&... params) {
  String argValues[sizeof...(Params)] = {str(params)...};
  return makeDescriptionInternal(macroArgs, arrayPtr(argValues, sizeof...(Params)));
}